

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_construct.cc
# Opt level: O0

void __thiscall re2c::Cond::Cond(Cond *this,string *cmp,uint32_t val)

{
  uint32_t val_local;
  string *cmp_local;
  Cond *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)cmp);
  this->value = val;
  return;
}

Assistant:

Cond::Cond (const std::string & cmp, uint32_t val)
	: compare (cmp)
	, value (val)
{}